

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *__return_storage_ptr__;
  byte bVar1;
  int iVar2;
  char *__s;
  unsigned_long *puVar3;
  failure *e;
  ofstream outfp;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> binary;
  string input_text;
  char *pcStack_28;
  int i;
  char *output_file;
  char *input_file;
  char **argv_local;
  int argc_local;
  
  output_file = (char *)0x0;
  pcStack_28 = (char *)0x0;
  input_text.field_2._12_4_ = 1;
  do {
    if (argc <= (int)input_text.field_2._12_4_) {
      if (output_file == (char *)0x0) {
        fatal_error("no input file");
      }
      if (pcStack_28 == (char *)0x0) {
        fatal_error("no output file");
      }
      __return_storage_ptr__ =
           &binary.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      read_file_abi_cxx11_((string *)__return_storage_ptr__,output_file);
      __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
      nxas::assemble((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,&local_88,
                     output_file);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      std::ofstream::ofstream(&e,pcStack_28,_S_bin);
      bVar1 = std::ofstream::is_open();
      if ((bVar1 & 1) == 0) {
        fatal_error("%s: failed to open",pcStack_28);
      }
      puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
      std::ostream::write((char *)&e,(long)puVar3);
      std::ofstream::~ofstream(&e);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
      std::__cxx11::string::~string
                ((string *)
                 &binary.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return 0;
    }
    iVar2 = strcmp(argv[(int)input_text.field_2._12_4_],"-o");
    if (iVar2 == 0) {
      if (pcStack_28 != (char *)0x0) {
        fatal_error("command line output file already provided");
      }
      input_text.field_2._12_4_ = input_text.field_2._12_4_ + 1;
      if (input_text.field_2._12_4_ == argc) {
        fatal_error("expected command line syntax: \"-o\" <output file>");
      }
      pcStack_28 = argv[(int)input_text.field_2._12_4_];
    }
    else {
      if (output_file != (char *)0x0) {
        fatal_error("command line input file already provided");
      }
      output_file = argv[(int)input_text.field_2._12_4_];
    }
    input_text.field_2._12_4_ = input_text.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    const char* input_file = nullptr;
    const char* output_file = nullptr;

    for (int i = 1; i < argc; ++i) {
        // Parse output file
        if (std::strcmp(argv[i], "-o") == 0) {
            if (output_file) {
                fatal_error("command line output file already provided");
            }
            if (++i == argc) {
                fatal_error("expected command line syntax: \"-o\" <output file>");
            }
            output_file = argv[i];
            continue;
        }
        // There's no modifier, it's an input file
        if (input_file) {
            fatal_error("command line input file already provided");
        }
        input_file = argv[i];
    }
    if (!input_file) {
        fatal_error("no input file");
    }
    if (!output_file) {
        fatal_error("no output file");
    }
    const std::string input_text = read_file(input_file);
    const std::vector<uint64_t> binary = nxas::assemble(input_text.c_str(), input_file);
    try {
        std::ofstream outfp(output_file, std::ios::binary);
        if (!outfp.is_open()) {
            fatal_error("%s: failed to open", output_file);
        }
        outfp.write(reinterpret_cast<const char*>(binary.data()), binary.size() * sizeof(uint64_t));
    } catch (const std::ios_base::failure& e) {
        fatal_error("failed to write output file: %s", e.what());
    }
}